

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O2

void __thiscall Expr::GenEval(Expr *this,Output *out_cc,Env *env)

{
  bool bVar1;
  RecordField *pRVar2;
  char *pcVar3;
  Type *pTVar4;
  Env *env_00;
  string *this_00;
  long lVar5;
  string v0;
  string v1;
  string local_88 [3];
  
  this_00 = &v0;
  switch(this->expr_type_) {
  case EXPR_ID:
    bVar1 = Env::Evaluated(env,this->id_);
    if (!bVar1) {
      Env::Evaluate(env,out_cc,this->id_);
    }
    Env::RValue(env,this->id_);
    goto LAB_00118594;
  case EXPR_NUM:
LAB_00118594:
    std::__cxx11::string::assign((char *)&this->str_);
    return;
  case EXPR_SUBSCRIPT:
    GenEval(this->operand_[0],out_cc,env);
    GenEval(this->operand_[1],out_cc,env);
    pcVar3 = EvalExpr(this->operand_[0],out_cc,env);
    std::__cxx11::string::string<std::allocator<char>>((string *)&v0,pcVar3,(allocator<char> *)&v1);
    pcVar3 = EvalExpr(this->operand_[1],out_cc,env);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&v1,pcVar3,(allocator<char> *)local_88);
    pTVar4 = DataType(this->operand_[0],env);
    if (pTVar4 == (Type *)0x0) {
      strfmt_abi_cxx11_(local_88,"%s[%s]",v0._M_dataplus._M_p,v1._M_dataplus._M_p);
    }
    else {
      (*(pTVar4->super_DataDepElement)._vptr_DataDepElement[9])(local_88,pTVar4,&v0,&v1);
    }
    std::__cxx11::string::operator=((string *)&this->str_,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
    break;
  case EXPR_MEMBER:
    GenEval(this->operand_[0],out_cc,env);
    pTVar4 = DataType(this->operand_[0],env);
    if (pTVar4 != (Type *)0x0) {
      pcVar3 = EvalExpr(this->operand_[0],out_cc,env);
      (*(pTVar4->super_DataDepElement)._vptr_DataDepElement[8])(&v1,pTVar4,this->operand_[1]->id_);
      strfmt_abi_cxx11_(&v0,"%s%s",pcVar3,v1._M_dataplus._M_p);
      std::__cxx11::string::operator=((string *)&this->str_,(string *)&v0);
      std::__cxx11::string::~string((string *)&v0);
      this_00 = &v1;
      goto LAB_001186df;
    }
    strfmt_abi_cxx11_(&v0,"->%s()",(this->operand_[1]->id_->name)._M_dataplus._M_p);
    pcVar3 = EvalExpr(this->operand_[0],out_cc,env);
    strfmt_abi_cxx11_(&v1,"%s%s",pcVar3,v0._M_dataplus._M_p);
    std::__cxx11::string::operator=((string *)&this->str_,(string *)&v1);
    break;
  case EXPR_CALLARGS:
    EvalExprList_abi_cxx11_(&v0,this->args_,out_cc,env);
    std::__cxx11::string::operator=((string *)&this->str_,(string *)&v0);
    goto LAB_001186df;
  case EXPR_SIZEOF:
    pRVar2 = anon_unknown.dwarf_822b7::GetRecordField(this->operand_[0]->id_,env);
    if (pRVar2 == (RecordField *)0x0) {
      return;
    }
    pcVar3 = RecordField::FieldSize(pRVar2,out_cc,env);
    strfmt_abi_cxx11_(&v0,"%s",pcVar3);
    goto LAB_00118622;
  case EXPR_OFFSETOF:
    pRVar2 = anon_unknown.dwarf_822b7::GetRecordField(this->operand_[0]->id_,env);
    pcVar3 = RecordField::FieldOffset(pRVar2,out_cc,env);
    strfmt_abi_cxx11_(&v0,"%s",pcVar3);
LAB_00118622:
    std::__cxx11::string::operator=((string *)&this->str_,(string *)&v0);
    this_00 = &v0;
    goto LAB_001186df;
  default:
    if (this->expr_type_ == EXPR_CASE) {
      GenCaseEval(this,out_cc,env);
      return;
    }
  case EXPR_CSTR:
  case EXPR_REGEX:
  case EXPR_PAREN:
  case EXPR_CALL:
    env_00 = (Env *)out_cc;
    for (lVar5 = 0xc; lVar5 != 0xf; lVar5 = lVar5 + 1) {
      if (this->operand_[lVar5 + -0xc] != (Expr *)0x0) {
        env_00 = (Env *)out_cc;
        GenEval(this->operand_[lVar5 + -0xc],out_cc,env);
      }
    }
    GenStrFromFormat(this,env_00);
    return;
  }
  this_00 = &v0;
  std::__cxx11::string::~string((string *)&v1);
LAB_001186df:
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void Expr::GenEval(Output* out_cc, Env* env)
	{
	switch ( expr_type_ )
		{
		case EXPR_NUM:
			str_ = num_->Str();
			break;

		case EXPR_ID:
			if ( ! env->Evaluated(id_) )
				env->Evaluate(out_cc, id_);
			str_ = env->RValue(id_);
			break;

		case EXPR_MEMBER:
			{
			/*
			For member expressions such X.Y, evaluating
			X only is sufficient. (Actually trying to
			evaluate Y will lead to error because Y is
			not defined in the current environment.)
			*/
			operand_[0]->GenEval(out_cc, env);

			Type* ty0 = operand_[0]->DataType(env);

			if ( ty0 )
				{
				str_ = strfmt("%s%s", operand_[0]->EvalExpr(out_cc, env),
				              ty0->EvalMember(operand_[1]->id()).c_str());
				}
			else
				{
				string tmp = strfmt("->%s()", operand_[1]->id()->Name());
				str_ = strfmt("%s%s", operand_[0]->EvalExpr(out_cc, env), tmp.c_str());
				}
			}
			break;

		case EXPR_SUBSCRIPT:
			{
			operand_[0]->GenEval(out_cc, env);
			operand_[1]->GenEval(out_cc, env);

			string v0 = operand_[0]->EvalExpr(out_cc, env);
			string v1 = operand_[1]->EvalExpr(out_cc, env);

			Type* ty0 = operand_[0]->DataType(env);
			if ( ty0 )
				str_ = ty0->EvalElement(v0, v1);
			else
				str_ = strfmt("%s[%s]", v0.c_str(), v1.c_str());
			}
			break;

		case EXPR_SIZEOF:
			{
			const ID* id = operand_[0]->id();
			RecordField* rf;
			Type* ty;

			try
				{
				if ( (rf = GetRecordField(id, env)) != nullptr )
					{
					str_ = strfmt("%s", rf->FieldSize(out_cc, env));
					}
				}
			catch ( ExceptionIDNotFound& e )
				{
				if ( (ty = TypeDecl::LookUpType(id)) != nullptr )
					{
					int ty_size = ty->StaticSize(global_env());
					if ( ty_size >= 0 )
						str_ = strfmt("%d", ty_size);
					else
						throw Exception(id, "unknown size");
					}
				else
					throw Exception(id, "not a record field or type");
				}
			}
			break;

		case EXPR_OFFSETOF:
			{
			const ID* id = operand_[0]->id();
			RecordField* rf = GetRecordField(id, env);
			str_ = strfmt("%s", rf->FieldOffset(out_cc, env));
			}
			break;

		case EXPR_CALLARGS:
			str_ = EvalExprList(args_, out_cc, env);
			break;

		case EXPR_CASE:
			GenCaseEval(out_cc, env);
			break;

		default:
			// Evaluate every operand by default
			for ( int i = 0; i < 3; ++i )
				if ( operand_[i] )
					operand_[i]->GenEval(out_cc, env);
			GenStrFromFormat(env);
			break;
		}
	}